

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

double __thiscall QVariant::toDouble(QVariant *this,bool *ok)

{
  double dVar1;
  
  dVar1 = qNumVariantToHelper<double>(&this->d,ok);
  return dVar1;
}

Assistant:

double QVariant::toDouble(bool *ok) const
{
    return qNumVariantToHelper<double>(d, ok);
}